

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O3

bool __thiscall
IRT::MemPattern::TryToGenerateCode
          (MemPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMemExpression *this_00;
  CExpression *pCVar1;
  CTempExpression *this_01;
  CTemp *__args_1;
  INode *pIVar2;
  CTemp source;
  undefined1 local_a0 [32];
  INode *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68;
  _Alloc_hider _Stack_60;
  INode *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (tree == (INode *)0x0) {
    return false;
  }
  this_00 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
  if (this_00 != (CMemExpression *)0x0) {
    pCVar1 = CMemExpression::getAddress(this_00);
    if ((pCVar1 == (CExpression *)0x0) ||
       (this_01 = (CTempExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
       this_01 == (CTempExpression *)0x0)) {
      CTemp::CTemp((CTemp *)&local_50);
      pIVar2 = (INode *)CMemExpression::getAddress(this_00);
      local_78._M_allocated_capacity = (size_type)(element_type *)&local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,local_50._M_allocated_capacity,
                 (undefined1 *)(local_50._8_8_ + local_50._M_allocated_capacity));
      if ((element_type *)local_78._M_allocated_capacity == (element_type *)&local_68) {
        local_a0._24_8_ = _Stack_60._M_p;
        local_a0._0_8_ = (element_type *)(local_a0 + 0x10);
      }
      else {
        local_a0._0_8_ = local_78._M_allocated_capacity;
      }
      local_a0._8_8_ = local_78._8_8_;
      local_78._8_8_ = 0;
      local_68 = 0;
      local_80 = pIVar2;
      local_78._M_allocated_capacity = (size_type)(element_type *)&local_68;
      local_58 = pIVar2;
      std::
      vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
      ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                  *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_a0);
      if ((element_type *)local_a0._0_8_ != (element_type *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_);
      }
      if ((element_type *)local_78._M_allocated_capacity != (element_type *)&local_68) {
        operator_delete((void *)local_78._M_allocated_capacity);
      }
      local_a0._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveRegMemCommand,std::allocator<AssemblyCode::MoveRegMemCommand>,IRT::CTemp_const&,IRT::CTemp&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                 (MoveRegMemCommand **)local_a0,
                 (allocator<AssemblyCode::MoveRegMemCommand> *)&local_78,dest,(CTemp *)&local_50);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_allocated_capacity != &local_40) {
        operator_delete((void *)local_50._M_allocated_capacity);
      }
    }
    else {
      __args_1 = CTempExpression::getTemprorary(this_01);
      local_a0._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveRegMemCommand,std::allocator<AssemblyCode::MoveRegMemCommand>,IRT::CTemp_const&,IRT::CTemp_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8),
                 (MoveRegMemCommand **)local_a0,
                 (allocator<AssemblyCode::MoveRegMemCommand> *)&local_78,dest,__args_1);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
    }
    return true;
  }
  return false;
}

Assistant:

bool IRT::MemPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                         AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(memPtr->getAddress( ));
        if ( constTempPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, constTempPtr->getTemprorary( )));
        } else {
            CTemp source;
            children.push_back( std::make_pair( source, memPtr->getAddress( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, source ));
        }
        return true;
    }
    return false;
}